

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFileSpecObjectHelper::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFileSpecObjectHelper *this)

{
  bool bVar1;
  string local_98;
  allocator<char> local_71;
  string local_70 [48];
  QPDFObjectHandle desc;
  QPDFFileSpecObjectHelper *this_local;
  string *result;
  
  desc.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/Desc",&local_71);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xffffffffffffffd0,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffc0);
  bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              (&local_98,(QPDFObjectHandle *)&stack0xffffffffffffffd0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  desc.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if ((desc.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFileSpecObjectHelper::getDescription()
{
    std::string result;
    auto desc = oh().getKey("/Desc");
    if (desc.isString()) {
        result = desc.getUTF8Value();
    }
    return result;
}